

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O0

void anon_unknown.dwarf_63f9::GetWindowedWaveform
               (double *x,int x_length,int fs,double current_f0,double current_position,
               int window_type,double window_length_ratio,double *waveform,RandnState *randn_state)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int half_window_length_00;
  ulong uVar6;
  int *base_index_00;
  int *safe_index_00;
  double *window_00;
  double dVar7;
  int local_94;
  int i_2;
  double weighting_coefficient;
  double dStack_80;
  int i_1;
  double tmp_weight2;
  double tmp_weight1;
  int i;
  double *window;
  int *safe_index;
  int *base_index;
  int half_window_length;
  RandnState *randn_state_local;
  double *waveform_local;
  double window_length_ratio_local;
  int window_type_local;
  double current_position_local;
  double current_f0_local;
  int fs_local;
  int x_length_local;
  double *x_local;
  
  half_window_length_00 = matlab_round(((window_length_ratio * (double)fs) / current_f0) / 2.0);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(half_window_length_00 * 2 + 1);
  uVar6 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  base_index_00 = (int *)operator_new__(uVar6);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(half_window_length_00 * 2 + 1);
  uVar6 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  safe_index_00 = (int *)operator_new__(uVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(half_window_length_00 * 2 + 1);
  uVar6 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  window_00 = (double *)operator_new__(uVar6);
  SetParametersForGetWindowedWaveform
            (half_window_length_00,x_length,current_position,fs,current_f0,window_type,
             window_length_ratio,base_index_00,safe_index_00,window_00);
  for (tmp_weight1._4_4_ = 0;
      tmp_weight1._4_4_ == half_window_length_00 * 2 ||
      SBORROW4(tmp_weight1._4_4_,half_window_length_00 * 2) !=
      tmp_weight1._4_4_ + half_window_length_00 * -2 < 0; tmp_weight1._4_4_ = tmp_weight1._4_4_ + 1)
  {
    dVar1 = x[safe_index_00[tmp_weight1._4_4_]];
    dVar2 = window_00[tmp_weight1._4_4_];
    dVar7 = randn(randn_state);
    waveform[tmp_weight1._4_4_] = dVar1 * dVar2 + dVar7 * 1e-06;
  }
  tmp_weight2 = 0.0;
  dStack_80 = 0.0;
  for (weighting_coefficient._4_4_ = 0;
      weighting_coefficient._4_4_ == half_window_length_00 * 2 ||
      SBORROW4(weighting_coefficient._4_4_,half_window_length_00 * 2) !=
      weighting_coefficient._4_4_ + half_window_length_00 * -2 < 0;
      weighting_coefficient._4_4_ = weighting_coefficient._4_4_ + 1) {
    tmp_weight2 = waveform[weighting_coefficient._4_4_] + tmp_weight2;
    dStack_80 = window_00[weighting_coefficient._4_4_] + dStack_80;
  }
  for (local_94 = 0;
      local_94 == half_window_length_00 * 2 ||
      SBORROW4(local_94,half_window_length_00 * 2) != local_94 + half_window_length_00 * -2 < 0;
      local_94 = local_94 + 1) {
    waveform[local_94] = -window_00[local_94] * (tmp_weight2 / dStack_80) + waveform[local_94];
  }
  if (base_index_00 != (int *)0x0) {
    operator_delete__(base_index_00);
  }
  if (safe_index_00 != (int *)0x0) {
    operator_delete__(safe_index_00);
  }
  if (window_00 != (double *)0x0) {
    operator_delete__(window_00);
  }
  return;
}

Assistant:

static void GetWindowedWaveform(const double *x, int x_length, int fs,
    double current_f0, double current_position, int window_type,
    double window_length_ratio, double *waveform, RandnState *randn_state) {
  int half_window_length =
    matlab_round(window_length_ratio * fs / current_f0 / 2.0);

  int *base_index = new int[half_window_length * 2 + 1];
  int *safe_index = new int[half_window_length * 2 + 1];
  double *window  = new double[half_window_length * 2 + 1];

  SetParametersForGetWindowedWaveform(half_window_length, x_length,
      current_position, fs, current_f0, window_type, window_length_ratio,
      base_index, safe_index, window);

  // F0-adaptive windowing
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] =
      x[safe_index[i]] * window[i] + randn(randn_state) * world::kSafeGuardD4C;

  double tmp_weight1 = 0;
  double tmp_weight2 = 0;
  for (int i = 0; i <= half_window_length * 2; ++i) {
    tmp_weight1 += waveform[i];
    tmp_weight2 += window[i];
  }
  double weighting_coefficient = tmp_weight1 / tmp_weight2;
  for (int i = 0; i <= half_window_length * 2; ++i)
    waveform[i] -= window[i] * weighting_coefficient;

  delete[] base_index;
  delete[] safe_index;
  delete[] window;
}